

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O3

VSFrameRef *
VSInterface::GetFrame<MiniDeen>
          (int n,int activationReason,void **instanceData,void **frameData,VSFrameContext *frameCtx,
          VSCore *core,VSAPI *vsapi)

{
  long lVar1;
  int iVar2;
  mapped_type *pmVar3;
  VSFrameRef *pVVar4;
  int *i;
  uchar **ppuVar5;
  long *plVar6;
  int *piVar7;
  unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
  in_frames;
  __alloc_node_gen_t __alloc_node_gen;
  int local_1d4;
  int *local_1d0;
  uchar **local_1c8;
  VSCore *local_1c0;
  long *local_1b8;
  _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1b0;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_DSFrame>,_false>_>_>
  local_178;
  uchar **local_170;
  uchar **local_168;
  int *local_160;
  VSFrameRef *local_130;
  VSFrameRef *local_128;
  VSAPI *local_118;
  _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  plVar6 = (long *)*instanceData;
  lVar1 = plVar6[0xc];
  if (lVar1 != 0) {
    *(VSFrameContext **)(lVar1 + 0x20) = frameCtx;
  }
  local_1d4 = n;
  local_1c0 = core;
  if (activationReason == 2) {
    local_1b0._M_buckets = &local_1b0._M_single_bucket;
    local_1b0._M_bucket_count = 1;
    local_1b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1b0._M_element_count = 0;
    local_1b0._M_rehash_policy._M_max_load_factor = 1.0;
    local_1b0._M_rehash_policy._M_next_resize = 0;
    local_1b0._M_single_bucket = (__node_base_ptr)0x0;
    if (lVar1 == 0) {
      DSFrame::DSFrame((DSFrame *)&local_170,core,vsapi);
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_1b0,&local_1d4);
      DSFrame::operator=(pmVar3,(DSFrame *)&local_170);
      DSFrame::~DSFrame((DSFrame *)&local_170);
      local_1c8 = (uchar **)0x0;
      piVar7 = (int *)0x0;
    }
    else {
      local_1b8 = plVar6;
      (**(code **)(*plVar6 + 0x40))(&local_170,plVar6,n);
      local_1c8 = local_170;
      plVar6 = local_1b8;
      piVar7 = local_160;
      if (local_170 != local_168) {
        local_1d0 = local_160;
        ppuVar5 = local_170;
        do {
          pVVar4 = (*vsapi->getFrameFilter)(*(int *)ppuVar5,*(VSNodeRef **)(lVar1 + 8),frameCtx);
          DSFrame::DSFrame((DSFrame *)&local_170,pVVar4,local_1c0,vsapi);
          pmVar3 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_1b0,(key_type *)ppuVar5);
          DSFrame::operator=(pmVar3,(DSFrame *)&local_170);
          DSFrame::~DSFrame((DSFrame *)&local_170);
          ppuVar5 = (uchar **)((long)ppuVar5 + 4);
          plVar6 = local_1b8;
          piVar7 = local_1d0;
        } while (ppuVar5 != local_168);
      }
    }
    iVar2 = local_1d4;
    local_178._M_h = (__hashtable_alloc *)&local_a0;
    local_a0._M_buckets = (__buckets_ptr)0x0;
    local_a0._M_bucket_count = local_1b0._M_bucket_count;
    local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a0._M_element_count = local_1b0._M_element_count;
    local_a0._M_rehash_policy._4_4_ = local_1b0._M_rehash_policy._4_4_;
    local_a0._M_rehash_policy._M_max_load_factor = local_1b0._M_rehash_policy._M_max_load_factor;
    local_a0._M_rehash_policy._M_next_resize = local_1b0._M_rehash_policy._M_next_resize;
    local_a0._M_single_bucket = (__node_base_ptr)0x0;
    std::
    _Hashtable<int,std::pair<int_const,DSFrame>,std::allocator<std::pair<int_const,DSFrame>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    _M_assign<std::_Hashtable<int,std::pair<int_const,DSFrame>,std::allocator<std::pair<int_const,DSFrame>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,DSFrame>,false>>>>
              ((_Hashtable<int,std::pair<int_const,DSFrame>,std::allocator<std::pair<int_const,DSFrame>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)local_178._M_h,&local_1b0,&local_178);
    (**(code **)(*plVar6 + 0x48))(&local_170,plVar6,iVar2,&local_a0);
    if ((local_128 == (VSFrameRef *)0x0) && (local_128 = local_130, local_130 == (VSFrameRef *)0x0))
    {
      pVVar4 = (VSFrameRef *)0x0;
    }
    else {
      pVVar4 = (*local_118->cloneFrameRef)(local_128);
    }
    DSFrame::~DSFrame((DSFrame *)&local_170);
    std::
    _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_a0);
    std::
    _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_1b0);
    local_170 = local_1c8;
  }
  else {
    if (activationReason != 0) {
      return (VSFrameRef *)0x0;
    }
    if (lVar1 == 0) {
      local_1b0._M_buckets = &local_1b0._M_single_bucket;
      local_1b0._M_bucket_count = 1;
      local_1b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_1b0._M_element_count = 0;
      local_1b0._M_rehash_policy._M_max_load_factor = 1.0;
      local_1b0._M_rehash_policy._M_next_resize = 0;
      local_1b0._M_single_bucket = (__node_base_ptr)0x0;
      DSFrame::DSFrame((DSFrame *)&local_170,core,vsapi);
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_1b0,&local_1d4);
      DSFrame::operator=(pmVar3,(DSFrame *)&local_170);
      DSFrame::~DSFrame((DSFrame *)&local_170);
      iVar2 = local_1d4;
      local_178._M_h = (__hashtable_alloc *)&local_68;
      local_68._M_buckets = (__buckets_ptr)0x0;
      local_68._M_bucket_count = local_1b0._M_bucket_count;
      local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_68._M_element_count = local_1b0._M_element_count;
      local_68._M_rehash_policy._4_4_ = local_1b0._M_rehash_policy._4_4_;
      local_68._M_rehash_policy._M_max_load_factor = local_1b0._M_rehash_policy._M_max_load_factor;
      local_68._M_rehash_policy._M_next_resize = local_1b0._M_rehash_policy._M_next_resize;
      local_68._M_single_bucket = (__node_base_ptr)0x0;
      std::
      _Hashtable<int,std::pair<int_const,DSFrame>,std::allocator<std::pair<int_const,DSFrame>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_assign<std::_Hashtable<int,std::pair<int_const,DSFrame>,std::allocator<std::pair<int_const,DSFrame>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,DSFrame>,false>>>>
                ((_Hashtable<int,std::pair<int_const,DSFrame>,std::allocator<std::pair<int_const,DSFrame>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_178._M_h,&local_1b0,&local_178);
      (**(code **)(*plVar6 + 0x48))(&local_170,plVar6,iVar2,&local_68);
      if ((local_128 == (VSFrameRef *)0x0) &&
         (local_128 = local_130, local_130 == (VSFrameRef *)0x0)) {
        pVVar4 = (VSFrameRef *)0x0;
      }
      else {
        pVVar4 = (*local_118->cloneFrameRef)(local_128);
      }
      DSFrame::~DSFrame((DSFrame *)&local_170);
      std::
      _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_68);
      std::
      _Hashtable<int,_std::pair<const_int,_DSFrame>,_std::allocator<std::pair<const_int,_DSFrame>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_1b0);
      return pVVar4;
    }
    (**(code **)(*plVar6 + 0x40))(&local_170,plVar6,n);
    local_1d0 = local_160;
    pVVar4 = (VSFrameRef *)0x0;
    piVar7 = local_160;
    if (local_170 != local_168) {
      local_1c8 = local_170;
      ppuVar5 = local_170;
      do {
        (*vsapi->requestFrameFilter)(*(int *)ppuVar5,*(VSNodeRef **)(lVar1 + 8),frameCtx);
        ppuVar5 = (uchar **)((long)ppuVar5 + 4);
        local_170 = local_1c8;
        piVar7 = local_1d0;
      } while (ppuVar5 != local_168);
    }
  }
  if (local_170 != (uchar **)0x0) {
    operator_delete(local_170,(long)piVar7 - (long)local_170);
  }
  return pVVar4;
}

Assistant:

const VSFrameRef* VS_CC GetFrame(int n, int activationReason, void **instanceData, void **frameData, VSFrameContext *frameCtx, VSCore *core, const VSAPI *vsapi) {
    auto filter = reinterpret_cast<FilterType*>(*instanceData);
    auto functor = reinterpret_cast<VSFetchFrameFunctor*>(filter->fetch_frame);
    if (functor)
      functor->_frameCtx = frameCtx;

    std::vector<int> ref_frames;
    if (activationReason == VSActivationReason::arInitial) {
      if (functor) {
        ref_frames = filter->RequestReferenceFrames(n);
        for (auto &&i : ref_frames)
          vsapi->requestFrameFilter(i, functor->_vs_clip, frameCtx);
      }
      else {
        std::unordered_map<int, DSFrame> in_frames;
        in_frames[n] = DSFrame(core, vsapi);
        auto vs_frame = (filter->GetFrame(n, in_frames).ToVSFrame());
        return vs_frame;
      }
    }
    else if (activationReason == VSActivationReason::arAllFramesReady) {
      std::unordered_map<int, DSFrame> in_frames;
      if (functor) {
        ref_frames = filter->RequestReferenceFrames(n);
        for (auto &&i : ref_frames)
          in_frames[i] = DSFrame(vsapi->getFrameFilter(i, functor->_vs_clip, frameCtx), core, vsapi);
      }
      else
        in_frames[n] = DSFrame(core, vsapi);

      auto vs_frame = (filter->GetFrame(n, in_frames).ToVSFrame());
      return vs_frame;
    }
    return nullptr;
  }